

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O1

void Abc_NtkConvertDcLatches(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  long lVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pNodeTo;
  long lVar7;
  uint uVar8;
  
  lVar2 = (long)pNtk->vBoxes->nSize;
  if (0 < lVar2) {
    lVar7 = 0;
    do {
      pvVar1 = pNtk->vBoxes->pArray[lVar7];
      if (((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) && (*(long *)((long)pvVar1 + 0x38) == 3)) {
        pAVar3 = Abc_NtkCreateNodeConst1(pNtk);
        pAVar3 = Abc_NtkAddLatch(pNtk,pAVar3,ABC_INIT_ZERO);
        pVVar4 = pNtk->vBoxes;
        if (pVVar4->nSize < 1) {
          uVar8 = 0;
        }
        else {
          lVar2 = 0;
          uVar8 = 0;
          do {
            pObj = (Abc_Obj_t *)pVVar4->pArray[lVar2];
            if (((*(uint *)&pObj->field_0x14 & 0xf) == 8) && ((pObj->field_5).pData == (void *)0x3))
            {
              pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              pAVar5 = Abc_NodeFindCoFanout
                                 ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray]);
              if (pAVar5 != (Abc_Obj_t *)0x0) {
                Nm_ManDeleteIdName(pObj->pNtk->pManName,
                                   *(int *)((long)pObj->pNtk->vObjs->pArray
                                                  [*(pObj->vFanouts).pArray] + 0x10));
                pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray];
                pcVar6 = Abc_ObjName(pObj);
                Abc_ObjAssignName(pAVar5,pcVar6,"_lo");
              }
              pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
              pcVar6 = Abc_ObjName(pObj);
              Abc_ObjAssignName(pAVar5,pcVar6,"_pi");
              pNodeTo = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
              Abc_ObjTransferFanout
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray],pNodeTo);
              Abc_NtkNodeConvertToMux
                        (pNtk,pAVar3,
                         (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray],pAVar5,
                         pNodeTo);
              uVar8 = uVar8 + 1;
            }
            lVar2 = lVar2 + 1;
            pVVar4 = pNtk->vBoxes;
          } while (lVar2 < pVVar4->nSize);
        }
        printf("The number of converted latches with DC values = %d.\n",(ulong)uVar8);
        return;
      }
      lVar7 = lVar7 + 1;
    } while (lVar2 != lVar7);
  }
  return;
}

Assistant:

void Abc_NtkConvertDcLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pCtrl, * pLatch, * pMux, * pPi;
    Abc_InitType_t Init = ABC_INIT_ZERO;
    int i, fFound = 0, Counter;
    // check if there are latches with DC values
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;
    // add control latch
    pCtrl = Abc_NtkAddLatch( pNtk, Abc_NtkCreateNodeConst1(pNtk), Init );
    // add fanouts for each latch with DC values
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( !Abc_LatchIsInitDc(pLatch) )
            continue;
        // change latch value
        pLatch->pData = (void *)Init;
        // if the latch output has the same name as a PO, rename it
        if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pLatch) ) )
        {
            Nm_ManDeleteIdName( pLatch->pNtk->pManName, Abc_ObjFanout0(pLatch)->Id );
            Abc_ObjAssignName( Abc_ObjFanout0(pLatch), Abc_ObjName(pLatch), "_lo" );
        }
        // create new PIs
        pPi = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pPi, Abc_ObjName(pLatch), "_pi" );
        // create a new node and transfer fanout from latch output to the new node
        pMux = Abc_NtkCreateNode( pNtk );
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pMux );
        // convert the node into a mux
        Abc_NtkNodeConvertToMux( pNtk, pCtrl, Abc_ObjFanout0(pLatch), pPi, pMux );
        Counter++;
    }
    printf( "The number of converted latches with DC values = %d.\n", Counter );
}